

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O0

int * __thiscall despot::Grid<int>::operator()(Grid<int> *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  Coord local_20 [8];
  int local_18;
  int local_14;
  int y_local;
  int x_local;
  Grid<int> *this_local;
  
  local_18 = y;
  local_14 = x;
  _y_local = this;
  despot::Coord::Coord(local_20,x,y);
  bVar1 = Inside(this,local_20);
  if (!bVar1) {
    __assert_fail("Inside(Coord(x, y))",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/grid.h"
                  ,0x3b,"const T &despot::Grid<int>::operator()(int, int) const [T = int]");
  }
  iVar2 = Index(this,local_14,local_18);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->grid_,(long)iVar2);
  return pvVar3;
}

Assistant:

const T& operator()(int x, int y) const {
		assert(Inside(Coord(x, y)));
		return grid_[Index(x, y)];
	}